

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token,Value *decoded)

{
  uint uVar1;
  istream *piVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  double value;
  String buffer;
  IStringStream is;
  ValueHolder local_238;
  long local_230;
  size_type local_228;
  long lStack_220;
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,token->start_,token->end_);
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)local_1d0,_S_in);
  piVar2 = std::istream::_M_extract<double>((double *)local_1b0);
  uVar1 = *(uint *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18) + 0x20);
  if ((uVar1 & 5) == 0) {
    Value::Value((Value *)&local_238,0.0);
    Value::operator=(decoded,(Value *)&local_238);
    Value::~Value((Value *)&local_238);
  }
  else {
    local_210[0] = local_200;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,token->start_,token->end_);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_210,0,(char *)0x0,0x15be08);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_1e0 = *plVar4;
      lStack_1d8 = plVar3[3];
      local_1f0 = &local_1e0;
    }
    else {
      local_1e0 = *plVar4;
      local_1f0 = (long *)*plVar3;
    }
    local_1e8 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      local_228 = *psVar5;
      lStack_220 = plVar3[3];
      local_238.string_ = (char *)&local_228;
    }
    else {
      local_228 = *psVar5;
      local_238.string_ = ((char *)*plVar3).string_;
    }
    local_230 = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    addError(this,(String *)&local_238,token,(Location)0x0);
    if (local_238 != &local_228) {
      operator_delete(local_238.string_);
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0);
    }
    if (local_210[0] != local_200) {
      operator_delete(local_210[0]);
    }
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0]);
  }
  return (uVar1 & 5) == 0;
}

Assistant:

bool Reader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  String buffer(token.start_, token.end_);
  IStringStream is(buffer);
  if (!(is >> value))
    return addError(
        "'" + String(token.start_, token.end_) + "' is not a number.", token);
  decoded = value;
  return true;
}